

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

Vector3f pbrt::EqualAreaSquareToSphere(Point2f *p)

{
  undefined1 auVar1 [16];
  Tuple3<pbrt::Vector3,_float> TVar2;
  int __x;
  float *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  Float sinPhi;
  Float cosPhi;
  Float sinTheta;
  anon_class_1_0_00000001 FlipSign;
  Float z;
  Float r2;
  Float phi;
  Float r;
  Float d;
  Float sd;
  Float av;
  Float au;
  Float v;
  Float u;
  float in_stack_ffffffffffffff88;
  Float in_stack_ffffffffffffff8c;
  anon_class_1_0_00000001 *this;
  float local_64;
  anon_class_1_0_00000001 local_41;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe4;
  LogLevel in_stack_fffffffffffffff4;
  undefined4 uStack_8;
  float local_4;
  
  if ((((0.0 <= *in_RDI) && (*in_RDI <= 1.0)) && (0.0 <= in_RDI[1])) && (in_RDI[1] <= 1.0)) {
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)*in_RDI),
                             SUB6416(ZEXT464(0xbf800000),0));
    fVar3 = auVar1._0_4_;
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)in_RDI[1]),
                             SUB6416(ZEXT464(0xbf800000),0));
    fVar4 = auVar1._0_4_;
    std::abs((int)in_RDI);
    __x = (int)in_RDI;
    std::abs(__x);
    fVar5 = 1.0 - (fVar3 + fVar4);
    std::abs(__x);
    local_34 = 1.0 - fVar5;
    if ((local_34 != 0.0) || (NAN(local_34))) {
      local_64 = (fVar4 - fVar3) / local_34 + 1.0;
    }
    else {
      local_64 = 1.0;
    }
    local_38 = local_64;
    local_3c = local_34 * local_34;
    local_40 = 1.0 - local_3c;
    this = &local_41;
    local_40 = EqualAreaSquareToSphere::anon_class_1_0_00000001::operator()
                         (this,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    fVar5 = local_34;
    SafeSqrt(0.0);
    ApproxCos((Float)((ulong)this >> 0x20));
    EqualAreaSquareToSphere::anon_class_1_0_00000001::operator()
              (this,fVar5,in_stack_ffffffffffffff88);
    ApproxSin((Float)((ulong)this >> 0x20));
    EqualAreaSquareToSphere::anon_class_1_0_00000001::operator()
              (this,fVar5,in_stack_ffffffffffffff88);
    Vector3<float>::Vector3((Vector3<float> *)this,fVar5,in_stack_ffffffffffffff88,0.0);
    TVar2.y = (float)uStack_8;
    TVar2.x = (float)in_stack_fffffffffffffff4;
    TVar2.z = local_4;
    return (Vector3f)TVar2;
  }
  LogFatal<char_const(&)[45]>
            (in_stack_fffffffffffffff4,(char *)in_RDI,in_stack_ffffffffffffffe4,
             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (char (*) [45])CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
}

Assistant:

Vector3f EqualAreaSquareToSphere(const Point2f &p) {
    CHECK(p.x >= 0 && p.x <= 1 && p.y >= 0 && p.y <= 1);

    // Transform p from [0,1] to [-1,1]
    Float u = 2 * p.x - 1, v = 2 * p.y - 1;

    // Take the absolute values to move u,v to the first quadrant
    Float au = std::abs(u), av = std::abs(v);

    // Compute the radius based on the signed distance along the diagonal
    Float sd = 1 - (au + av);
    Float d = std::abs(sd);
    Float r = 1 - d;

    // Compute phi*2/pi based on u, v and r (avoid div-by-zero if r=0)
    Float phi = r == 0 ? 1 : (av - au) / r + 1;  // phi = [0,2)

    // Compute the z coordinate (flip sign based on signed distance)
    Float r2 = r * r;
    Float z = 1 - r2;

    // Return a float with a's magnitude, but negated if b is negative.
    auto FlipSign = [](Float a, Float b) {
        return BitsToFloat(FloatToBits(a) ^ SignBit(b));
    };
    z = FlipSign(z, sd);
    Float sinTheta = r * SafeSqrt(2 - r2);

    // Flip signs of sin/cos based on signs of u,v
    Float cosPhi = FlipSign(ApproxCos(phi), u);
    Float sinPhi = FlipSign(ApproxSin(phi), v);

    return {sinTheta * cosPhi, sinTheta * sinPhi, z};
}